

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSettingsRemoveNodeReferences(ImGuiID *node_ids,int node_ids_count)

{
  ImGuiContext *pIVar1;
  int local_34;
  ImGuiWindowSettings *pIStack_30;
  int node_n;
  ImGuiWindowSettings *settings;
  int found;
  ImGuiContext *g;
  int node_ids_count_local;
  ImGuiID *node_ids_local;
  
  pIVar1 = GImGui;
  settings._4_4_ = 0;
  pIStack_30 = ImChunkStream<ImGuiWindowSettings>::begin(&GImGui->SettingsWindows);
  do {
    if (pIStack_30 == (ImGuiWindowSettings *)0x0) {
      return;
    }
    for (local_34 = 0; local_34 < node_ids_count; local_34 = local_34 + 1) {
      if (pIStack_30->DockId == node_ids[local_34]) {
        pIStack_30->DockId = 0;
        pIStack_30->DockOrder = -1;
        settings._4_4_ = settings._4_4_ + 1;
        if (node_ids_count <= settings._4_4_) {
          return;
        }
        break;
      }
    }
    pIStack_30 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar1->SettingsWindows,pIStack_30)
    ;
  } while( true );
}

Assistant:

static void ImGui::DockSettingsRemoveNodeReferences(ImGuiID* node_ids, int node_ids_count)
{
    ImGuiContext& g = *GImGui;
    int found = 0;
    //// FIXME-OPT: We could remove this loop by storing the index in the map
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        for (int node_n = 0; node_n < node_ids_count; node_n++)
            if (settings->DockId == node_ids[node_n])
            {
                settings->DockId = 0;
                settings->DockOrder = -1;
                if (++found < node_ids_count)
                    break;
                return;
            }
}